

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket.cc
# Opt level: O0

void __thiscall CSocekt::zdClosesocketProc(CSocekt *this,lp_connection_t p_Conn)

{
  int iVar1;
  long in_RSI;
  long in_RDI;
  lp_connection_t in_stack_00000028;
  CSocekt *in_stack_00000030;
  lp_connection_t in_stack_00000048;
  CSocekt *in_stack_00000050;
  
  if (*(int *)(in_RDI + 0x1a00) == 1) {
    DeleteFromTimerQueue(in_stack_00000050,in_stack_00000048);
  }
  if (*(int *)(in_RSI + 8) != -1) {
    close(*(int *)(in_RSI + 8));
    *(undefined4 *)(in_RSI + 8) = 0xffffffff;
  }
  iVar1 = muduo::detail::AtomicIntegerT<int>::get((AtomicIntegerT<int> *)(in_RSI + 0xe0));
  if (0 < iVar1) {
    muduo::detail::AtomicIntegerT<int>::decrement((AtomicIntegerT<int> *)0x13ad39);
  }
  inRecyConnectQueue(in_stack_00000030,in_stack_00000028);
  return;
}

Assistant:

void CSocekt::zdClosesocketProc(lp_connection_t p_Conn)
{
    if(m_ifkickTimeCount == 1)
    {
        DeleteFromTimerQueue(p_Conn); //从时间队列中把连接干掉
    }
    if(p_Conn->fd != -1)
    {   
        close(p_Conn->fd); //这个socket关闭，关闭后epoll就会被从红黑树中删除，所以这之后无法收到任何epoll事件
        p_Conn->fd = -1;
    }

    if(p_Conn->iThrowsendCount.get() > 0)  
        p_Conn->iThrowsendCount.decrement();   //归0

    inRecyConnectQueue(p_Conn);
    return;
}